

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void close_func(LexState *ls)

{
  FuncState *fs;
  lua_State *L;
  Proto *pPVar1;
  int first;
  Instruction *pIVar2;
  ls_byte *plVar3;
  AbsLineInfo *pAVar4;
  TValue *pTVar5;
  Proto **ppPVar6;
  LocVar *pLVar7;
  Upvaldesc *pUVar8;
  
  fs = ls->fs;
  L = ls->L;
  pPVar1 = fs->f;
  first = luaY_nvarstack(fs);
  luaK_ret(fs,first,0);
  leaveblock(fs);
  luaK_finish(fs);
  pIVar2 = (Instruction *)luaM_shrinkvector_(L,pPVar1->code,&pPVar1->sizecode,fs->pc,4);
  pPVar1->code = pIVar2;
  plVar3 = (ls_byte *)luaM_shrinkvector_(L,pPVar1->lineinfo,&pPVar1->sizelineinfo,fs->pc,1);
  pPVar1->lineinfo = plVar3;
  pAVar4 = (AbsLineInfo *)
           luaM_shrinkvector_(L,pPVar1->abslineinfo,&pPVar1->sizeabslineinfo,fs->nabslineinfo,8);
  pPVar1->abslineinfo = pAVar4;
  pTVar5 = (TValue *)luaM_shrinkvector_(L,pPVar1->k,&pPVar1->sizek,fs->nk,0x10);
  pPVar1->k = pTVar5;
  ppPVar6 = (Proto **)luaM_shrinkvector_(L,pPVar1->p,&pPVar1->sizep,fs->np,8);
  pPVar1->p = ppPVar6;
  pLVar7 = (LocVar *)
           luaM_shrinkvector_(L,pPVar1->locvars,&pPVar1->sizelocvars,(int)fs->ndebugvars,0x10);
  pPVar1->locvars = pLVar7;
  pUVar8 = (Upvaldesc *)
           luaM_shrinkvector_(L,pPVar1->upvalues,&pPVar1->sizeupvalues,(uint)fs->nups,0x10);
  pPVar1->upvalues = pUVar8;
  ls->fs = fs->prev;
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
    return;
  }
  return;
}

Assistant:

static void close_func (LexState *ls) {
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  Proto *f = fs->f;
  luaK_ret(fs, luaY_nvarstack(fs), 0);  /* final return */
  leaveblock(fs);
  lua_assert(fs->bl == NULL);
  luaK_finish(fs);
  luaM_shrinkvector(L, f->code, f->sizecode, fs->pc, Instruction);
  luaM_shrinkvector(L, f->lineinfo, f->sizelineinfo, fs->pc, ls_byte);
  luaM_shrinkvector(L, f->abslineinfo, f->sizeabslineinfo,
                       fs->nabslineinfo, AbsLineInfo);
  luaM_shrinkvector(L, f->k, f->sizek, fs->nk, TValue);
  luaM_shrinkvector(L, f->p, f->sizep, fs->np, Proto *);
  luaM_shrinkvector(L, f->locvars, f->sizelocvars, fs->ndebugvars, LocVar);
  luaM_shrinkvector(L, f->upvalues, f->sizeupvalues, fs->nups, Upvaldesc);
  ls->fs = fs->prev;
  luaC_checkGC(L);
}